

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-surface.c
# Opt level: O0

plutovg_surface_t * plutovg_surface_load_from_image_data(void *data,int length)

{
  stbi_uc *image_00;
  stbi_uc *image;
  int channels;
  int height;
  int width;
  int length_local;
  void *data_local;
  
  height = length;
  _width = data;
  image_00 = stbi_load_from_memory
                       ((stbi_uc *)data,length,&channels,(int *)((long)&image + 4),(int *)&image,4);
  if (image_00 == (stbi_uc *)0x0) {
    data_local = (void *)0x0;
  }
  else {
    data_local = plutovg_surface_load_from_image(image_00,channels,image._4_4_);
  }
  return (plutovg_surface_t *)data_local;
}

Assistant:

plutovg_surface_t* plutovg_surface_load_from_image_data(const void* data, int length)
{
    int width, height, channels;
    stbi_uc* image = stbi_load_from_memory(data, length, &width, &height, &channels, STBI_rgb_alpha);
    if(image == NULL)
        return NULL;
    return plutovg_surface_load_from_image(image, width, height);
}